

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-expr.c
# Opt level: O0

int coda_expression_eval_string(coda_expression *expr,coda_cursor *cursor,char **value,long *length)

{
  int iVar1;
  char *__dest;
  char *truncated_value;
  long offset;
  eval_info info;
  long *length_local;
  char **value_local;
  coda_cursor *cursor_local;
  coda_expression *expr_local;
  
  info.variable_name = (char *)length;
  if (expr->result_type == coda_expression_string) {
    if ((cursor == (coda_cursor *)0x0) && (expr->is_constant == 0)) {
      coda_set_error(-100,"cursor argument may not be NULL if expression is not constant");
      expr_local._4_4_ = -1;
    }
    else {
      init_eval_info((eval_info *)&offset,cursor);
      iVar1 = eval_string((eval_info *)&offset,expr,(long *)&truncated_value,
                          (long *)info.variable_name,value);
      if (iVar1 == 0) {
        if (*(long *)info.variable_name < 1) {
          if (*value != (char *)0x0) {
            free(*value);
          }
          *value = (char *)0x0;
        }
        else {
          if (truncated_value != (char *)0x0) {
            __dest = (char *)malloc(*(long *)info.variable_name + 1);
            if (__dest == (char *)0x0) {
              coda_set_error(-1,"out of memory (could not allocate %ld bytes) (%s:%u)",
                             *(undefined8 *)info.variable_name,
                             "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                             ,0x14cb);
              return -1;
            }
            memcpy(__dest,*value + (long)truncated_value,*(size_t *)info.variable_name);
            free(*value);
            *value = __dest;
          }
          (*value)[*(long *)info.variable_name] = '\0';
        }
        expr_local._4_4_ = 0;
      }
      else {
        if ((cursor != (coda_cursor *)0x0) &&
           (iVar1 = coda_cursor_compare(cursor,(coda_cursor *)&info), iVar1 != 0)) {
          coda_cursor_add_to_error_message((coda_cursor *)&info);
        }
        expr_local._4_4_ = -1;
      }
    }
  }
  else {
    coda_set_error(-100,"expression is not a \'string\' expression");
    expr_local._4_4_ = -1;
  }
  return expr_local._4_4_;
}

Assistant:

LIBCODA_API int coda_expression_eval_string(const coda_expression *expr, const coda_cursor *cursor, char **value,
                                            long *length)
{
    eval_info info;
    long offset;

    if (expr->result_type != coda_expression_string)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "expression is not a 'string' expression");
        return -1;
    }
    if (cursor == NULL && !expr->is_constant)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "cursor argument may not be NULL if expression is not constant");
        return -1;
    }

    init_eval_info(&info, cursor);
    if (eval_string(&info, expr, &offset, length, value) != 0)
    {
        if (cursor != NULL && coda_cursor_compare(cursor, &info.cursor) != 0)
        {
            coda_cursor_add_to_error_message(&info.cursor);
        }
        return -1;
    }

    if (*length > 0)
    {
        if (offset != 0)
        {
            char *truncated_value;

            truncated_value = malloc(*length + 1);
            if (truncated_value == NULL)
            {
                coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %ld bytes) (%s:%u)",
                               *length, __FILE__, __LINE__);
                return -1;
            }
            memcpy(truncated_value, &(*value)[offset], *length);
            free(*value);
            *value = truncated_value;
        }
        (*value)[*length] = '\0';
    }
    else
    {
        if (*value != NULL)
        {
            free(*value);
        }
        *value = NULL;
    }

    return 0;
}